

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

PathTypeHandlerWithAttr *
Js::PathTypeHandlerWithAttr::New
          (ScriptContext *scriptContext,TypePath *typePath,ObjectSlotAttributes *attributes,
          PathTypeSetterSlotIndex *setters,PathTypeSetterSlotIndex setterCount,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  PathTypeHandlerWithAttr *this;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  data._32_8_ = setters;
  if (typePath == (TypePath *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xde7,"(typePath != nullptr)","typePath != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext->pathTypeHandlerCount = scriptContext->pathTypeHandlerCount + 1;
  local_70 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d33d42;
  data.filename._0_4_ = 0xdeb;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
  this = (PathTypeHandlerWithAttr *)new<Memory::Recycler>(0x50,alloc,0x38bbb2);
  PathTypeHandlerWithAttr
            (this,typePath,attributes,(PathTypeSetterSlotIndex *)data._32_8_,setterCount,pathLength,
             slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,isLocked,isShared,predecessorType);
  return this;
}

Assistant:

PathTypeHandlerWithAttr * PathTypeHandlerWithAttr::New(ScriptContext * scriptContext, TypePath* typePath, ObjectSlotAttributes * attributes, PathTypeSetterSlotIndex * setters, PathTypeSetterSlotIndex setterCount, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType)
    {
        Assert(typePath != nullptr);
#ifdef PROFILE_TYPES
        scriptContext->pathTypeHandlerCount++;
#endif
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeHandlerWithAttr, typePath, attributes, setters, setterCount, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType);
    }